

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_fft.cpp
# Opt level: O0

bool fft::RandomImageFFT(void)

{
  bool bVar1;
  BaseComplexData<kiss_fft_cpx> *pBVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uchar *puVar11;
  uint uVar12;
  uint8_t *inYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t width;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  Image output;
  FFTExecutor fftExecutor;
  ComplexData complexDataDracDelta;
  ComplexData complexDataInput;
  Image diracDelta;
  Image input;
  uint32_t dimension;
  uint32_t i;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  uint8_t in_stack_fffffffffffffe76;
  uint8_t in_stack_fffffffffffffe77;
  Image *in_stack_fffffffffffffe78;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe8f;
  uint32_t in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe94;
  uint32_t in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  uint32_t in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  uint32_t in_stack_fffffffffffffeb0;
  Image *local_108;
  ImageTemplate<unsigned_char> *local_100;
  ImageTemplate<unsigned_char> local_e8 [3];
  ImageTemplate<unsigned_char> local_60;
  ImageTemplate<unsigned_char> local_38;
  int local_c;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; local_8 < 0x20; local_8 = local_8 + 1) {
    bVar3 = Test_Helper::randomValue<unsigned_char>(0x18834a);
    local_c = 2 << (bVar3 & 0x1f);
    Unit_Test::randomImage(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (uint32_t)in_stack_fffffffffffffe78,in_stack_fffffffffffffe77,
               in_stack_fffffffffffffe76);
    PenguinV_Image::ImageTemplate<unsigned_char>::fill
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8f);
    puVar11 = PenguinV_Image::ImageTemplate<unsigned_char>::data(&local_60);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_60);
    uVar5 = uVar4 >> 1;
    uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(&local_60);
    iVar7 = uVar5 * uVar6;
    uVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_60);
    puVar11[iVar7 + (uVar8 >> 1)] = '\x01';
    FFT::ComplexData::ComplexData
              ((ComplexData *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    FFT::ComplexData::ComplexData
              ((ComplexData *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    uVar9 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    uVar10 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    FFT::FFTExecutor::FFTExecutor
              ((FFTExecutor *)in_stack_fffffffffffffe80,
               (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (uint32_t)in_stack_fffffffffffffe78);
    FFT::FFTExecutor::directTransform
              ((FFTExecutor *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (ComplexData *)in_stack_fffffffffffffe68);
    FFT::FFTExecutor::directTransform
              ((FFTExecutor *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (ComplexData *)in_stack_fffffffffffffe68);
    FFT::FFTExecutor::complexMultiplication
              ((FFTExecutor *)CONCAT44(uVar5,uVar8),(ComplexData *)CONCAT44(iVar7,uVar9),
               (ComplexData *)CONCAT44(uVar10,in_stack_fffffffffffffeb0),
               (ComplexData *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    FFT::FFTExecutor::inverseTransform
              ((FFTExecutor *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (ComplexData *)in_stack_fffffffffffffe68);
    FFT::ComplexData::get((ComplexData *)CONCAT44(uVar4,uVar6));
    in_stack_fffffffffffffeb0 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    in_stack_fffffffffffffeac = PenguinV_Image::ImageTemplate<unsigned_char>::height(local_e8);
    if (in_stack_fffffffffffffeb0 == in_stack_fffffffffffffeac) {
      in_stack_fffffffffffffea8 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
      uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(local_e8);
      if (in_stack_fffffffffffffea8 != uVar4) goto LAB_001885de;
      bVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_38);
      in_stack_fffffffffffffe9c = (uint)bVar3;
      bVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_e8);
      if (in_stack_fffffffffffffe9c != bVar3) goto LAB_001885de;
      uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(&local_38);
      in_stack_fffffffffffffe98 = uVar4;
      uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_e8);
      in_stack_fffffffffffffe94 = uVar6;
      in_stack_fffffffffffffe90 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
      in_stack_fffffffffffffe8f =
           PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_38);
      uVar5 = in_stack_fffffffffffffe90 * in_stack_fffffffffffffe8f;
      local_100 = (ImageTemplate<unsigned_char> *)
                  PenguinV_Image::ImageTemplate<unsigned_char>::data(&local_38);
      in_stack_fffffffffffffe80 = local_100;
      local_108 = (Image *)PenguinV_Image::ImageTemplate<unsigned_char>::data(local_e8);
      in_stack_fffffffffffffe68 = local_100;
      in_stack_fffffffffffffe70 = uVar4;
      in_stack_fffffffffffffe78 = local_108;
      uVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
      in_stack_fffffffffffffe74 = (undefined2)uVar8;
      in_stack_fffffffffffffe76 = (uint8_t)(uVar8 >> 0x10);
      in_stack_fffffffffffffe77 = (uint8_t)(uVar8 >> 0x18);
      uVar12 = in_stack_fffffffffffffe70 * uVar8;
      pBVar2 = (BaseComplexData<kiss_fft_cpx> *)&in_stack_fffffffffffffe68->_vptr_ImageTemplate;
      for (; local_100 !=
             (ImageTemplate<unsigned_char> *)((long)&pBVar2->_vptr_BaseComplexData + (ulong)uVar12);
          local_100 = (ImageTemplate<unsigned_char> *)
                      ((long)&((BaseComplexData<kiss_fft_cpx> *)&local_100->_vptr_ImageTemplate)->
                              _vptr_BaseComplexData + (ulong)uVar4)) {
        iVar7 = memcmp(local_100,local_108,(ulong)uVar5);
        if (iVar7 != 0) {
          local_1 = 0;
          bVar1 = true;
          goto LAB_0018882c;
        }
        local_108 = (Image *)((long)&local_108->_vptr_ImageTemplate + (ulong)uVar6);
      }
      bVar1 = false;
    }
    else {
LAB_001885de:
      local_1 = 0;
      bVar1 = true;
    }
LAB_0018882c:
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x188839);
    FFT::FFTExecutor::~FFTExecutor
              ((FFTExecutor *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))));
    FFT::ComplexData::~ComplexData
              ((ComplexData *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))));
    FFT::ComplexData::~ComplexData
              ((ComplexData *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x18886d);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x18887a);
    if (bVar1) goto LAB_001888ec;
  }
  local_1 = 1;
LAB_001888ec:
  return (bool)(local_1 & 1);
}

Assistant:

bool RandomImageFFT()
    {
        for ( uint32_t i = 0u; i < 32u; ++i ) { // a special case for FFT because it take a lot of time for execution
            const uint32_t dimension = (2u << Unit_Test::randomValue<uint8_t>( 11 ));

            const PenguinV_Image::Image input = Unit_Test::randomImage( dimension, dimension );

            PenguinV_Image::Image diracDelta( input.width(), input.height() );
            diracDelta.fill( 0u );
            diracDelta.data()[diracDelta.height() / 2 * diracDelta.rowSize() + diracDelta.width() / 2 ] = 1u;

            FFT::ComplexData complexDataInput( input );
            FFT::ComplexData complexDataDracDelta( diracDelta );

            FFT::FFTExecutor fftExecutor( input.width(), input.height() );

            fftExecutor.directTransform( complexDataInput );
            fftExecutor.directTransform( complexDataDracDelta );
            fftExecutor.complexMultiplication( complexDataInput, complexDataDracDelta, complexDataInput );
            fftExecutor.inverseTransform( complexDataInput );

            const PenguinV_Image::Image output = complexDataInput.get();

            if( input.height() != output.height() || input.width() != output.width() || input.colorCount() != output.colorCount() )
                return false;

            const uint32_t rowSizeIn  = input.rowSize();
            const uint32_t rowSizeOut = output.rowSize();
            const uint32_t width = input.width() * input.colorCount();
            const uint8_t * inY  = input.data();
            const uint8_t * outY = output.data();
            const uint8_t * inYEnd = inY + rowSizeIn * input.height();

            for ( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                if ( memcmp( inY, outY, width ) != 0 )
                    return false;
            }
        }
        return true;
    }